

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_minute(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
            *this,numeric_system ns)

{
  tm time;
  
  if (ns != standard) {
    time.tm_isdst = 0;
    time._36_4_ = 0;
    time.tm_gmtoff = 0;
    time.tm_mon = 0;
    time.tm_year = 0;
    time.tm_wday = 0;
    time.tm_yday = 0;
    time.tm_zone = (char *)0x0;
    time.tm_hour = 0;
    time.tm_mday = 0;
    time._0_8_ = ((this->s).__r / 0x3c) % 0x3c << 0x20;
    format_localized(this,&time,"%OM");
    return;
  }
  time.tm_zone = (char *)0x2;
  write(this,(int)(((this->s).__r / 0x3c) % 0x3c),(void *)0x2,0x3c);
  return;
}

Assistant:

void on_minute(numeric_system ns) {
    if (ns == numeric_system::standard)
      return write(minute(), 2);
    auto time = tm();
    time.tm_min = minute();
    format_localized(time, "%OM");
  }